

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  Elf64_Addr value;
  Args args;
  elfio input;
  undefined1 local_e8 [8];
  Args local_e0;
  elfio local_90;
  
  Args::parse(&local_e0,argc,argv);
  loadElf(&local_90,&local_e0.input);
  if (local_e0.printHighestVaddr == true) {
    findHighestVaddr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
         *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    local_e8[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_e8,1);
  }
  if (local_e0.printLowestVaddr == true) {
    findLowestVaddr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
         *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    local_e8[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_e8,1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_e0.printSymbolValue);
  if (iVar2 != 0) {
    bVar1 = findSymbolValue(&local_90,&local_e0.printSymbolValue,(Elf64_Addr *)local_e8);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
           *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      lVar4 = 1;
      pcVar5 = "\n";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No symbol named ",0x10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_e0.printSymbolValue._M_dataplus._M_p,
                          local_e0.printSymbolValue._M_string_length);
      lVar4 = 8;
      pcVar5 = " found.\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  }
  if (local_e0.printEntry == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
         *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    if (local_90.header == (elf_header *)0x0) {
      __assert_fail("header",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nfd[P]saruman/elfio-3.2/elfio/elfio.hpp"
                    ,0x115,"Elf64_Addr ELFIO::elfio::get_entry() const");
    }
    (*(local_90.header)->_vptr_elf_header[0x15])();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  ELFIO::elfio::~elfio(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.input._M_dataplus._M_p != &local_e0.input.field_2) {
    operator_delete(local_e0.input._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.printSymbolValue._M_dataplus._M_p != &local_e0.printSymbolValue.field_2) {
    operator_delete(local_e0.printSymbolValue._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	try {
		Args args = Args::parse(argc, argv);
		auto input = loadElf(args.input);

		if(args.printHighestVaddr) {
			ELFIO::Elf64_Addr vaddr = convertVma(findHighestVaddr(input), args);
			std::cout << "0x" << std::hex << vaddr << std::dec << '\n';
		}
		if(args.printLowestVaddr) {
			ELFIO::Elf64_Addr vaddr = convertVma(findLowestVaddr(input), args);
			std::cout << "0x" << std::hex << vaddr << std::dec << '\n';
		}
		if(args.printSymbolValue != "") {
			ELFIO::Elf64_Addr value;
			if(findSymbolValue(input, args.printSymbolValue, value)) {
				std::cout << "0x" << std::hex << value << std::dec << "\n";
			} else {
				std::cerr << "No symbol named " << args.printSymbolValue << " found.\n";
			}
		}
		if(args.printEntry) {
			std::cout << "0x" << std::hex << input.get_entry() << std::dec << "\n";
		}

	} catch (TCLAP::ArgException &e) {
		std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
		return 1;
	}

	return 0;
}